

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex
          (SubstitutionTreeClauseVariantIndex *this)

{
  bool bVar1;
  size_t sVar2;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar3;
  ClauseVariantIndex *in_RDI;
  Iterator it;
  uint i;
  uint streeArrSz;
  DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff98;
  DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffa0;
  LiteralSubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffffb0;
  uint local_10;
  
  in_RDI->_vptr_ClauseVariantIndex = (_func_int **)&PTR__SubstitutionTreeClauseVariantIndex_01309440
  ;
  sVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::size
                    ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                     (in_RDI + 6));
  for (local_10 = 0; local_10 < (uint)sVar2; local_10 = local_10 + 1) {
    ppLVar3 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                        ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                         in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    if (*ppLVar3 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
      ppLVar3 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                          ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                           in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffb0 = *ppLVar3;
      if (in_stack_ffffffffffffffb0 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        (*(in_stack_ffffffffffffffb0->super_LiteralIndexingStructure<Indexing::LiteralClause>).
          _vptr_LiteralIndexingStructure[1])();
      }
    }
  }
  Lib::List<Kernel::Clause_*>::destroy((List<Kernel::Clause_*> *)in_stack_ffffffffffffffb0);
  Lib::DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::Iterator::Iterator((Iterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  while (bVar1 = Lib::
                 DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::Iterator::hasNext((Iterator *)0x2fe459), bVar1) {
    in_stack_ffffffffffffffa0 =
         (DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)Lib::
            DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::Iterator::next((Iterator *)0x2fe473);
    Lib::List<Kernel::Clause_*>::destroy((List<Kernel::Clause_*> *)in_stack_ffffffffffffffb0);
  }
  Lib::ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::~ZIArray
            ((ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)0x2fe496);
  Lib::DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(in_stack_ffffffffffffffa0);
  ClauseVariantIndex::~ClauseVariantIndex(in_RDI);
  return;
}

Assistant:

SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex()
{
  unsigned streeArrSz=_strees.size();
  for(unsigned i=0;i<streeArrSz;i++) {
    if(_strees[i]!=0) {
      delete _strees[i];
    }
  }

  ClauseList::destroy(_emptyClauses);

  DHMap<Literal*, ClauseList*>::Iterator it(_groundUnits);
  while (it.hasNext()) {
    ClauseList::destroy(it.next());
  }
}